

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_checkoption(lua_State *L,int arg,char *def,char **lst)

{
  int iVar1;
  char *extramsg;
  char *local_48;
  int local_3c;
  int i;
  char *name;
  char **lst_local;
  char *def_local;
  int arg_local;
  lua_State *L_local;
  
  if (def == (char *)0x0) {
    local_48 = luaL_checklstring(L,arg,(size_t *)0x0);
  }
  else {
    local_48 = luaL_optlstring(L,arg,def,(size_t *)0x0);
  }
  local_3c = 0;
  while( true ) {
    if (lst[local_3c] == (char *)0x0) {
      extramsg = lua_pushfstring(L,"invalid option \'%s\'",local_48);
      iVar1 = luaL_argerror(L,arg,extramsg);
      return iVar1;
    }
    iVar1 = strcmp(lst[local_3c],local_48);
    if (iVar1 == 0) break;
    local_3c = local_3c + 1;
  }
  return local_3c;
}

Assistant:

LUALIB_API int luaL_checkoption (lua_State *L, int arg, const char *def,
                                 const char *const lst[]) {
  const char *name = (def) ? luaL_optstring(L, arg, def) :
                             luaL_checkstring(L, arg);
  int i;
  for (i=0; lst[i]; i++)
    if (strcmp(lst[i], name) == 0)
      return i;
  return luaL_argerror(L, arg,
                       lua_pushfstring(L, "invalid option '%s'", name));
}